

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

void j2k_read_qcd(opj_j2k_t *j2k)

{
  opj_image_t *poVar1;
  opj_cio_t *cio;
  uint uVar2;
  int pos;
  uint compno;
  
  poVar1 = j2k->image;
  cio = j2k->cio;
  uVar2 = cio_read(cio,2);
  pos = cio_tell(cio);
  for (compno = 0; compno < poVar1->numcomps; compno = compno + 1) {
    cio_seek(cio,pos);
    j2k_read_qcx(j2k,compno,uVar2 - 2);
  }
  return;
}

Assistant:

static void j2k_read_qcd(opj_j2k_t *j2k) {
	int len, i, pos;

	opj_cio_t *cio = j2k->cio;
	opj_image_t *image = j2k->image;
	
	len = cio_read(cio, 2);		/* Lqcd */
	pos = cio_tell(cio);
	for (i = 0; i < image->numcomps; i++) {
		cio_seek(cio, pos);
		j2k_read_qcx(j2k, i, len - 2);
	}
}